

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_STATUS
ref_egads_face_curvature_at
          (REF_GEOM ref_geom,REF_INT faceid,REF_INT degen,REF_DBL *uv,REF_DBL *kr,REF_DBL *r,
          REF_DBL *ks,REF_DBL *s)

{
  printf("curvature 0, 0: No EGADS linked for %s\n","ref_egads_face_curvature_at");
  *kr = 0.0;
  *r = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  *s = 0.0;
  s[1] = 1.0;
  s[2] = 0.0;
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_face_curvature_at(REF_GEOM ref_geom,
                                               REF_INT faceid, REF_INT degen,
                                               REF_DBL *uv, REF_DBL *kr,
                                               REF_DBL *r, REF_DBL *ks,
                                               REF_DBL *s) {
#ifdef HAVE_EGADS
  double curvature[8];
  ego *faces;
  ego object;
  int egads_status;
  RNS(ref_geom->faces, "faces not loaded");
  faces = (ego *)(ref_geom->faces);
  RAS(0 < faceid && faceid <= ref_geom->nface, "face out of range");
  object = faces[faceid - 1];
  RNS(object, "EGADS object is NULL. Has the geometry been loaded?");

#if !defined(HAVE_EGADS_LITE) && defined(HAVE_EGADS_EFFECTIVE)
  if (ref_geom_effective(ref_geom) && !ref_geom_effective_curvature(ref_geom)) {
    ego underlying_object;
    double underlying_uv[2];
    REIS(EGADS_SUCCESS,
         EG_effectiveMap(object, uv, &underlying_object, underlying_uv),
         "map effective to brep");
    object = underlying_object;
    uv[0] = underlying_uv[0];
    uv[1] = underlying_uv[1];
  }
#endif

  egads_status = EG_curvature(object, uv, curvature);
  /* classic marked degen where u or v collapses to a point, move tangent */
  if (0 != degen || EGADS_DEGEN == egads_status) {
    REF_DBL du, dv;
    ego ref, *pchldrn;
    int oclass, mtype, nchild, *psens;
    double uv_range[4];
    double params[2];
    double eval[18];
    REF_DBL shift = 1.0e-2;
    params[0] = uv[0];
    params[1] = uv[1];
    REIS(EGADS_SUCCESS, EG_evaluate(object, params, eval), "eval derivs");
    du = sqrt(ref_math_dot(&(eval[3]), &(eval[3])));
    dv = sqrt(ref_math_dot(&(eval[6]), &(eval[6])));
    REIS(EGADS_SUCCESS,
         EG_getTopology(object, &ref, &oclass, &mtype, uv_range, &nchild,
                        &pchldrn, &psens),
         "EG topo face");
    /* move toward the center along the uv with largest dervative norm */
    if (du > dv) {
      params[0] =
          (1.0 - shift) * params[0] + shift * 0.5 * (uv_range[0] + uv_range[1]);
    } else {
      params[1] =
          (1.0 - shift) * params[1] + shift * 0.5 * (uv_range[2] + uv_range[3]);
    }
    egads_status = EG_curvature(object, params, curvature);
  }
  /* line or internal degen, move normal */
  if (EGADS_DEGEN == egads_status) {
    REF_DBL du, dv;
    ego ref, *pchldrn;
    int oclass, mtype, nchild, *psens;
    double uv_range[4];
    double params[2];
    double eval[18];
    REF_DBL shift = 1.0e-2;
    params[0] = uv[0];
    params[1] = uv[1];
    REIS(EGADS_SUCCESS, EG_evaluate(object, params, eval), "eval derivs");
    du = sqrt(ref_math_dot(&(eval[3]), &(eval[3])));
    dv = sqrt(ref_math_dot(&(eval[6]), &(eval[6])));
    REIS(EGADS_SUCCESS,
         EG_getTopology(object, &ref, &oclass, &mtype, uv_range, &nchild,
                        &pchldrn, &psens),
         "EG topo face");
    /* move toward the center along the uv with largest dervative norm */
    if (du <= dv) {
      params[0] =
          (1.0 - shift) * params[0] + shift * 0.5 * (uv_range[0] + uv_range[1]);
    } else {
      params[1] =
          (1.0 - shift) * params[1] + shift * 0.5 * (uv_range[2] + uv_range[3]);
    }
    egads_status = EG_curvature(object, params, curvature);
  }
  if (EGADS_SUCCESS == egads_status) {
    *kr = curvature[0];
    r[0] = curvature[1];
    r[1] = curvature[2];
    r[2] = curvature[3];
    *ks = curvature[4];
    s[0] = curvature[5];
    s[1] = curvature[6];
    s[2] = curvature[7];
    return REF_SUCCESS;
  }
  if (EGADS_NOTGEOM == egads_status) {
    /* EFFECTIVE */
    *kr = 0.0;
    r[0] = 1.0;
    r[1] = 0.0;
    r[2] = 0.0;
    *ks = 0.0;
    s[0] = 0.0;
    s[1] = 1.0;
    s[2] = 0.0;
    return REF_SUCCESS;
  }
  printf("EG_curvature %d (-24 is DEGEN) faceid %d u %f v %f\n", egads_status,
         faceid, uv[0], uv[1]);
  *kr = 0.0;
  r[0] = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  s[0] = 0.0;
  s[1] = 1.0;
  s[2] = 0.0;
  return REF_FAILURE;
#else
  printf("curvature 0, 0: No EGADS linked for %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(faceid);
  SUPRESS_UNUSED_COMPILER_WARNING(degen);
  SUPRESS_UNUSED_COMPILER_WARNING(uv);
  *kr = 0.0;
  r[0] = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  s[0] = 0.0;
  s[1] = 1.0;
  s[2] = 0.0;
  return REF_IMPLEMENT;
#endif
}